

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

QUrl __thiscall QTextBrowserPrivate::resolveUrl(QTextBrowserPrivate *this,QUrl *url)

{
  qsizetype qVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  QUrl *in_RDX;
  long in_FS_OFFSET;
  QFileInfo fi;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QUrl local_a0;
  undefined1 *local_98;
  QArrayDataPointer<char16_t> local_90;
  QFileInfo local_78 [8];
  QArrayDataPointer<char16_t> local_70;
  QStringBuilder<QString,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QUrl::isRelative();
  if (cVar2 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QUrl::QUrl((QUrl *)this,in_RDX);
      return (QUrl)(QUrlPrivate *)this;
    }
    goto LAB_00465564;
  }
  cVar2 = QUrl::isRelative();
  if (cVar2 == '\0') {
    QUrl::scheme();
    local_b8.d = (Data *)0x4;
    local_b8.ptr = L"file";
    bVar4 = ::operator==((QString *)&local_70,(QLatin1StringView *)&local_b8);
    if (bVar4) {
      QUrl::toLocalFile();
      QFileInfo::QFileInfo(local_78,(QString *)&local_90);
      bVar4 = QFileInfo::isAbsolute(local_78);
      if (!bVar4) goto LAB_0046530c;
      QFileInfo::~QFileInfo(local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
LAB_0046541a:
    QUrl::resolved((QUrl *)this);
  }
  else {
LAB_0046530c:
    cVar3 = QUrl::hasFragment();
    if (cVar3 == '\0') {
      if (cVar2 == '\0') {
        QFileInfo::~QFileInfo(local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
    }
    else {
      QUrl::path(&local_58);
      qVar1 = local_58.a.d.size;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      if (cVar2 == '\0') {
        QFileInfo::~QFileInfo(local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      }
      if (qVar1 == 0) goto LAB_0046541a;
    }
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    cVar2 = QFileInfo::exists();
    if (cVar2 == '\0') {
      QUrl::QUrl((QUrl *)this,in_RDX);
    }
    else {
      QFileInfo::absolutePath();
      local_58.a.d.size = local_d8.size;
      local_58.a.d.ptr = local_d8.ptr;
      local_58.a.d.d = local_d8.d;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      local_58.b.ucs = L'/';
      QStringBuilder<QString,_QChar>::convertTo<QString>((QString *)&local_b8,&local_58);
      QUrl::fromLocalFile((QString *)&local_a0);
      QUrl::resolved((QUrl *)this);
      QUrl::~QUrl(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)(QUrlPrivate *)this;
  }
LAB_00465564:
  __stack_chk_fail();
}

Assistant:

QUrl QTextBrowserPrivate::resolveUrl(const QUrl &url) const
{
    if (!url.isRelative())
        return url;

    // For the second case QUrl can merge "#someanchor" with "foo.html"
    // correctly to "foo.html#someanchor"
    if (!(currentURL.isRelative()
          || (currentURL.scheme() == "file"_L1
              && !QFileInfo(currentURL.toLocalFile()).isAbsolute()))
          || (url.hasFragment() && url.path().isEmpty())) {
        return currentURL.resolved(url);
    }

    // this is our last resort when current url and new url are both relative
    // we try to resolve against the current working directory in the local
    // file system.
    QFileInfo fi(currentURL.toLocalFile());
    if (fi.exists()) {
        return QUrl::fromLocalFile(fi.absolutePath() + QDir::separator()).resolved(url);
    }

    return url;
}